

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::generateFunctionDef
          (string *__return_storage_ptr__,SparseTextureClampLookupColorTestCase *this,
          string *funcName)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  
  lVar1 = std::__cxx11::string::find((char *)funcName,0x1ab778e,0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (lVar1 == -1) {
    pcVar3 = 
    "    retValue<COMPONENT_DEF> = <FUNCTION>(uni_in,\n                                         <POINT_COORD><SAMPLE_DEF><ARGUMENTS>);\n"
    ;
    pcVar2 = "";
  }
  else {
    pcVar3 = 
    "    <FUNCTION>(uni_in,\n               <POINT_COORD><SAMPLE_DEF><ARGUMENTS>,\n               retValue<COMPONENT_DEF>);\n"
    ;
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string SparseTextureClampLookupColorTestCase::generateFunctionDef(std::string funcName)
{
	if (funcName.find("sparse", 0) != std::string::npos)
	{
		return std::string("    <FUNCTION>(uni_in,\n"
						   "               <POINT_COORD><SAMPLE_DEF><ARGUMENTS>,\n"
						   "               retValue<COMPONENT_DEF>);\n");
	}
	else
	{
		return std::string("    retValue<COMPONENT_DEF> = <FUNCTION>(uni_in,\n"
						   "                                         <POINT_COORD><SAMPLE_DEF><ARGUMENTS>);\n");
	}
}